

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::cleanQueryObject(FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_qo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x458))(1,&this->m_qo_id);
    this->m_qo_id = 0;
  }
  return;
}

Assistant:

void gl4cts::ConditionalRenderInverted::FunctionalTest::cleanQueryObject()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean query object. */
	if (m_qo_id)
	{
		gl.deleteQueries(1, &m_qo_id);

		m_qo_id = 0;
	}
}